

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O0

void * Ver_FormulaReduction(char *pFormula,void *pMan,Vec_Ptr_t *vNames,char *pErrorMessage)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  char local_41;
  char Symbol;
  int fCompl;
  int v;
  Hop_Obj_t *pRes;
  char *pErrorMessage_local;
  Vec_Ptr_t *vNames_local;
  void *pMan_local;
  char *pFormula_local;
  
  _fCompl = (Hop_Obj_t *)0x0;
  local_41 = *pFormula;
  bVar4 = local_41 == '~';
  pMan_local = pFormula + 1;
  if (bVar4 != 0) {
    pMan_local = pFormula + 2;
    local_41 = pFormula[1];
  }
  if (((local_41 == '&') || (local_41 == '|')) || (local_41 == '^')) {
    do {
      pvVar3 = (void *)((long)pMan_local + 1);
      cVar1 = *pMan_local;
      pMan_local = pvVar3;
    } while (cVar1 != '{');
    Vec_PtrClear(vNames);
    while (*pMan_local != '}') {
      iVar2 = Ver_FormulaParserFindVar((char *)pMan_local,vNames);
      pvVar3 = Vec_PtrEntry(vNames,iVar2 << 1);
      pMan_local = (void *)((long)pMan_local + (long)(int)pvVar3);
      while( true ) {
        bVar5 = true;
        if (*pMan_local != ' ') {
          bVar5 = *pMan_local == ',';
        }
        if (!bVar5) break;
        pMan_local = (void *)((long)pMan_local + 1);
      }
    }
    if (local_41 == '&') {
      iVar2 = Vec_PtrSize(vNames);
      _fCompl = Hop_CreateAnd((Hop_Man_t *)pMan,iVar2 / 2);
    }
    else if (local_41 == '|') {
      iVar2 = Vec_PtrSize(vNames);
      _fCompl = Hop_CreateOr((Hop_Man_t *)pMan,iVar2 / 2);
    }
    else if (local_41 == '^') {
      iVar2 = Vec_PtrSize(vNames);
      _fCompl = Hop_CreateExor((Hop_Man_t *)pMan,iVar2 / 2);
    }
    pFormula_local = (char *)Hop_NotCond(_fCompl,(uint)bVar4);
  }
  else {
    sprintf(pErrorMessage,"Ver_FormulaReduction(): Unknown operation (%c)\n",
            (ulong)(uint)(int)local_41);
    pFormula_local = (char *)0x0;
  }
  return pFormula_local;
}

Assistant:

void * Ver_FormulaReduction( char * pFormula, void * pMan, Vec_Ptr_t * vNames, char * pErrorMessage )
{
    Hop_Obj_t * pRes = NULL;
    int v, fCompl;
    char Symbol;

    // get the operation
    Symbol = *pFormula++;
    fCompl = ( Symbol == '~' );
    if ( fCompl )
        Symbol = *pFormula++;
    // check the operation
    if ( Symbol != '&' && Symbol != '|' && Symbol != '^' )
    {
        sprintf( pErrorMessage, "Ver_FormulaReduction(): Unknown operation (%c)\n", Symbol );
        return NULL;
    }
    // skip the brace
    while ( *pFormula++ != '{' );
    // parse the names
    Vec_PtrClear( vNames );
    while ( *pFormula != '}' )
    {
        v = Ver_FormulaParserFindVar( pFormula, vNames );
        pFormula += (int)(ABC_PTRUINT_T)Vec_PtrEntry( vNames, 2*v );
        while ( *pFormula == ' ' || *pFormula == ',' )
            pFormula++;
    }
    // compute the function
    if ( Symbol == '&' )
        pRes = Hop_CreateAnd( (Hop_Man_t *)pMan, Vec_PtrSize(vNames)/2 );
    else if ( Symbol == '|' )
        pRes = Hop_CreateOr( (Hop_Man_t *)pMan, Vec_PtrSize(vNames)/2 );
    else if ( Symbol == '^' )
        pRes = Hop_CreateExor( (Hop_Man_t *)pMan, Vec_PtrSize(vNames)/2 );
    return Hop_NotCond( pRes, fCompl );
}